

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_linux.h
# Opt level: O3

void snmalloc::PALLinux::notify_not_using(void *p,size_t size)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  madvise(p,size,8);
  mprotect(p,size,0);
  *piVar2 = iVar1;
  return;
}

Assistant:

static void notify_not_using(void* p, size_t size) noexcept
    {
      KeepErrno k;
      SNMALLOC_ASSERT(is_aligned_block<page_size>(p, size));

      // Fill memory so that when we switch the pages back on we don't make
      // assumptions on the content.
      if constexpr (Debug)
        memset(p, 0x5a, size);

      madvise(p, size, madvise_free_flags);

      if constexpr (mitigations(pal_enforce_access))
      {
        mprotect(p, size, PROT_NONE);
      }
    }